

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_Hook_amd64_gcc.cpp
# Opt level: O0

Hook * __thiscall
axl::spy::HookArena::allocate
          (HookArena *this,void *targetFunc,void *callbackParam,HookEnterFunc *enterFunc,
          HookLeaveFunc *leaveFunc)

{
  ExecutableBlockArena<axl::spy::Hook> *in_RCX;
  void *in_RDX;
  void *in_RSI;
  HookLeaveFunc *in_R8;
  Hook *hook;
  Hook *local_8;
  
  local_8 = mem::ExecutableBlockArena<axl::spy::Hook>::allocate(in_RCX);
  if (local_8 == (Hook *)0x0) {
    local_8 = (Hook *)0x0;
  }
  else {
    __wrap_memcpy(in_RDX,in_RCX,(size_t)in_R8);
    *(Hook **)(local_8->m_thunkCode + 0x5f) = local_8;
    *(Hook **)(local_8->m_thunkCode + 0x154) = local_8;
    *(void **)(local_8->m_thunkCode + 0xf4) = in_RSI;
    *(uint8_t **)(local_8->m_thunkCode + 0xe6) = local_8->m_thunkCode + 0x125;
    *(code **)(local_8->m_thunkCode + 0x70) = hookEnter;
    *(code **)(local_8->m_thunkCode + 0x164) = hookLeave;
    (local_8->m_context).m_targetFunc = in_RSI;
    (local_8->m_context).m_callbackParam = in_RDX;
    (local_8->m_context).m_enterFunc = (HookEnterFunc *)in_RCX;
    (local_8->m_context).m_leaveFunc = in_R8;
  }
  return local_8;
}

Assistant:

Hook*
HookArena::allocate(
	void* targetFunc,
	void* callbackParam,
	HookEnterFunc* enterFunc,
	HookLeaveFunc* leaveFunc
) {
	Hook* hook = ((mem::ExecutableBlockArena<Hook>*)m_impl)->allocate();
	if (!hook)
		return NULL;

	memcpy(hook->m_thunkCode, g_thunkCode, sizeof(g_thunkCode));
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_HookPtr1) = hook;
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_HookPtr2) = hook;
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_TargetFuncPtr) = targetFunc;
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_HookRetPtr) = hook->m_thunkCode + ThunkCodeOffset_HookRet;
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_HookEnterPtr) = (void*)hookEnter;
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_HookLeavePtr) = (void*)hookLeave;

	hook->m_context.m_targetFunc = targetFunc;
	hook->m_context.m_callbackParam = callbackParam;
	hook->m_context.m_enterFunc = enterFunc;
	hook->m_context.m_leaveFunc = leaveFunc;
	return hook;
}